

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall QPDF::dumpHSharedObject(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  Pipeline *pPVar3;
  unsigned_long uVar4;
  reference pvVar5;
  long i_00;
  size_t i;
  ulong __n;
  QPDFLogger local_40;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  QPDFLogger::getInfo(&local_40,SUB81(*(undefined8 *)&(_Var1._M_head_impl)->log,0));
  pPVar3 = Pipeline::operator<<
                     ((Pipeline *)
                      local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,"first_shared_obj: ");
  pPVar3 = Pipeline::operator<<(pPVar3,((_Var1._M_head_impl)->shared_object_hints).first_shared_obj)
  ;
  pPVar3 = Pipeline::operator<<(pPVar3,"\n");
  pPVar3 = Pipeline::operator<<(pPVar3,"first_shared_offset: ");
  i_00 = *(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->shared_object_hints + 8);
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(qpdf_offset_t *)((long)&(_Var2._M_head_impl)->linp + 0x30) <= i_00) {
    i_00 = i_00 + *(qpdf_offset_t *)((long)&(_Var2._M_head_impl)->linp + 0x38);
  }
  pPVar3 = Pipeline::operator<<(pPVar3,i_00);
  pPVar3 = Pipeline::operator<<(pPVar3,"\n");
  pPVar3 = Pipeline::operator<<(pPVar3,"nshared_first_page: ");
  pPVar3 = Pipeline::operator<<
                     (pPVar3,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x10));
  pPVar3 = Pipeline::operator<<(pPVar3,"\n");
  pPVar3 = Pipeline::operator<<(pPVar3,"nshared_total: ");
  pPVar3 = Pipeline::operator<<
                     (pPVar3,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14));
  pPVar3 = Pipeline::operator<<(pPVar3,"\n");
  pPVar3 = Pipeline::operator<<(pPVar3,"nbits_nobjects: ");
  pPVar3 = Pipeline::operator<<
                     (pPVar3,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x18));
  pPVar3 = Pipeline::operator<<(pPVar3,"\n");
  pPVar3 = Pipeline::operator<<(pPVar3,"min_group_length: ");
  pPVar3 = Pipeline::operator<<
                     (pPVar3,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x1c));
  pPVar3 = Pipeline::operator<<(pPVar3,"\n");
  pPVar3 = Pipeline::operator<<(pPVar3,"nbits_delta_group_length: ");
  pPVar3 = Pipeline::operator<<
                     (pPVar3,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x20));
  Pipeline::operator<<(pPVar3,"\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  __n = 0;
  while( true ) {
    uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert
                      ((int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14));
    if (uVar4 <= __n) break;
    pvVar5 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       ((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                         *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28),__n);
    QPDFLogger::getInfo(&local_40,
                        SUB81(*(undefined8 *)
                               &((this->m)._M_t.
                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                 .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0
                             ));
    pPVar3 = Pipeline::operator<<
                       ((Pipeline *)
                        local_40.m.
                        super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        "Shared Object ");
    pPVar3 = Pipeline::operator<<(pPVar3,__n);
    pPVar3 = Pipeline::operator<<(pPVar3,":\n");
    pPVar3 = Pipeline::operator<<(pPVar3,"  group length: ");
    pPVar3 = Pipeline::operator<<
                       (pPVar3,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x1c) +
                               pvVar5->delta_group_length);
    Pipeline::operator<<(pPVar3,"\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (pvVar5->signature_present != 0) {
      QPDFLogger::getInfo(&local_40,
                          SUB81(*(undefined8 *)
                                 &((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log
                                ,0));
      Pipeline::operator<<
                ((Pipeline *)
                 local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,"  signature present\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    if (pvVar5->nobjects_minus_one != 0) {
      QPDFLogger::getInfo(&local_40,
                          SUB81(*(undefined8 *)
                                 &((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log
                                ,0));
      pPVar3 = Pipeline::operator<<
                         ((Pipeline *)
                          local_40.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,"  nobjects: ");
      pPVar3 = Pipeline::operator<<(pPVar3,pvVar5->nobjects_minus_one + 1);
      Pipeline::operator<<(pPVar3,"\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    __n = __n + 1;
  }
  return;
}

Assistant:

void
QPDF::dumpHSharedObject()
{
    HSharedObject& t = m->shared_object_hints;
    *m->log->getInfo() << "first_shared_obj: " << t.first_shared_obj << "\n"
                       << "first_shared_offset: " << adjusted_offset(t.first_shared_offset) << "\n"
                       << "nshared_first_page: " << t.nshared_first_page << "\n"
                       << "nshared_total: " << t.nshared_total << "\n"
                       << "nbits_nobjects: " << t.nbits_nobjects << "\n"
                       << "min_group_length: " << t.min_group_length << "\n"
                       << "nbits_delta_group_length: " << t.nbits_delta_group_length << "\n";

    for (size_t i = 0; i < toS(t.nshared_total); ++i) {
        HSharedObjectEntry& se = t.entries.at(i);
        *m->log->getInfo() << "Shared Object " << i << ":\n"
                           << "  group length: " << se.delta_group_length + t.min_group_length
                           << "\n";
        // PDF spec says signature present nobjects_minus_one are always 0, so print them only if
        // they have a non-zero value.
        if (se.signature_present) {
            *m->log->getInfo() << "  signature present\n";
        }
        if (se.nobjects_minus_one != 0) {
            *m->log->getInfo() << "  nobjects: " << se.nobjects_minus_one + 1 << "\n";
        }
    }
}